

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

string * __thiscall
ELFIO::dump::format_assoc<ELFIO::os_abi_table_t[20],unsigned_char>
          (string *__return_storage_ptr__,dump *this,os_abi_table_t (*table) [20],uchar *key)

{
  int iVar1;
  ostream *poVar2;
  ostringstream oss;
  string local_1b0;
  undefined7 uStack_1af;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  find_value_in_table<ELFIO::os_abi_table_t[20],unsigned_char>
            (__return_storage_ptr__,this,table,key);
  iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (0x",4);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    local_1b0 = (string)(*table)[0].key;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1b0,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,&local_1b0);
    if ((long *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
      operator_delete((long *)CONCAT71(uStack_1af,local_1b0),local_1a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string format_assoc( const T& table, const K& key )
    {
        std::string str = find_value_in_table( table, key );
        if ( str == "?" ) {
            std::ostringstream oss;
            oss << str << " (0x" << std::hex << key << ")";
            str = oss.str();
        }

        return str;
    }